

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall booster::log::sinks::syslog::syslog(syslog *this,int __pri,char *__fmt,...)

{
  string *psVar1;
  data *v;
  
  sink::sink(&this->super_sink);
  *(undefined ***)&((data *)this)->id = &PTR_log_002e8cd8;
  psVar1 = &((data *)this)->id;
  v = (data *)operator_new(0x28);
  data::data((data *)this);
  hold_ptr<booster::log::sinks::syslog::data>::hold_ptr
            ((hold_ptr<booster::log::sinks::syslog::data> *)&psVar1->_M_string_length,v);
  return;
}

Assistant:

syslog::syslog() : d(new data())
		{
		}